

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_item_t_conflict MIR_new_bss(MIR_context_t ctx,char *name,size_t len)

{
  MIR_func_t pMVar1;
  MIR_error_func_t p_Var2;
  MIR_item_t_conflict pMVar3;
  MIR_item_t_conflict local_30;
  MIR_item_t_conflict item;
  MIR_item_t_conflict tab_item;
  size_t len_local;
  char *name_local;
  MIR_context_t ctx_local;
  
  local_30 = create_item(ctx,MIR_bss_item,"bss");
  pMVar1 = (MIR_func_t)malloc(0x10);
  (local_30->u).func = pMVar1;
  if ((local_30->u).func == (MIR_func_t)0x0) {
    free(local_30);
    p_Var2 = MIR_get_error_func(ctx);
    (*p_Var2)(MIR_alloc_error,"Not enough memory for creation of bss %s",name);
  }
  len_local = (size_t)name;
  if (name != (char *)0x0) {
    len_local = (size_t)get_ctx_str(ctx,name);
  }
  ((local_30->u).func)->name = (char *)len_local;
  ((local_30->u).bss)->len = len;
  if (len_local == 0) {
    DLIST_MIR_item_t_append(&ctx->curr_module->items,local_30);
  }
  else {
    pMVar3 = add_item(ctx,local_30);
    if (pMVar3 != local_30) {
      free(local_30);
      local_30 = pMVar3;
    }
  }
  return local_30;
}

Assistant:

MIR_item_t MIR_new_bss (MIR_context_t ctx, const char *name, size_t len) {
  MIR_item_t tab_item, item = create_item (ctx, MIR_bss_item, "bss");

  item->u.bss = malloc (sizeof (struct MIR_bss));
  if (item->u.bss == NULL) {
    free (item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of bss %s", name);
  }
  if (name != NULL) name = get_ctx_str (ctx, name);
  item->u.bss->name = name;
  item->u.bss->len = len;
  if (name == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
  } else if ((tab_item = add_item (ctx, item)) != item) {
    free (item);
    item = tab_item;
  }
  return item;
}